

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

void * nghttp2_session_get_stream_user_data(nghttp2_session *session,int32_t stream_id)

{
  nghttp2_stream *pnVar1;
  undefined4 in_ESI;
  nghttp2_stream *stream;
  undefined8 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  void *local_8;
  
  pnVar1 = nghttp2_session_get_stream
                     ((nghttp2_session *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                      (int32_t)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  if (pnVar1 == (nghttp2_stream *)0x0) {
    local_8 = (void *)0x0;
  }
  else {
    local_8 = pnVar1->stream_user_data;
  }
  return local_8;
}

Assistant:

void *nghttp2_session_get_stream_user_data(nghttp2_session *session,
                                           int32_t stream_id) {
  nghttp2_stream *stream;
  stream = nghttp2_session_get_stream(session, stream_id);
  if (stream) {
    return stream->stream_user_data;
  } else {
    return NULL;
  }
}